

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.c
# Opt level: O3

void selecte(HuffmanTree *huffmanTree,int n,int *s1,int *s2)

{
  int iVar1;
  ulong uVar2;
  ulong uVar4;
  ulong uVar5;
  uint *puVar6;
  ulong uVar3;
  
  if (n < 1) {
    iVar1 = 1;
  }
  else {
    uVar5 = (ulong)(n + 1);
    puVar6 = &(*huffmanTree)[1].parent;
    uVar2 = 1;
    do {
      uVar3 = uVar2;
      if (*puVar6 == 0) break;
      uVar2 = uVar2 + 1;
      puVar6 = puVar6 + 4;
      uVar3 = uVar5;
    } while (uVar5 != uVar2);
    iVar1 = (int)uVar3;
    if (0 < n) {
      puVar6 = &(*huffmanTree)[1].parent;
      uVar2 = 1;
      do {
        if (*puVar6 == 0) {
          uVar4 = uVar2;
          if ((*huffmanTree)[(int)uVar3].weight <=
              ((anon_struct_16_4_a52fbe9e *)(puVar6 + -1))->weight) {
            uVar4 = uVar3;
          }
          uVar3 = uVar4 & 0xffffffff;
        }
        iVar1 = (int)uVar3;
        uVar2 = uVar2 + 1;
        puVar6 = puVar6 + 4;
      } while (uVar5 != uVar2);
      *s1 = iVar1;
      if (0 < n) {
        uVar3 = uVar3 & 0xffffffff;
        puVar6 = &(*huffmanTree)[1].parent;
        uVar2 = 1;
        do {
          if ((*puVar6 == 0) && (uVar4 = uVar2, uVar3 != uVar2)) break;
          uVar2 = uVar2 + 1;
          puVar6 = puVar6 + 4;
          uVar4 = uVar3;
        } while (uVar5 != uVar2);
        iVar1 = (int)uVar4;
        if (0 < n) {
          puVar6 = &(*huffmanTree)[1].parent;
          uVar2 = 1;
          do {
            if ((*puVar6 == 0) && (uVar3 != uVar2)) {
              uVar5 = uVar2;
              if ((*huffmanTree)[(int)uVar4].weight <=
                  ((anon_struct_16_4_a52fbe9e *)(puVar6 + -1))->weight) {
                uVar5 = uVar4;
              }
              uVar4 = uVar5 & 0xffffffff;
            }
            iVar1 = (int)uVar4;
            uVar2 = uVar2 + 1;
            puVar6 = puVar6 + 4;
          } while (n + 1 != uVar2);
        }
      }
      goto LAB_001012a6;
    }
  }
  *s1 = iVar1;
LAB_001012a6:
  *s2 = iVar1;
  return;
}

Assistant:

void selecte(HuffmanTree *huffmanTree,int n,int *s1,int *s2){
    //标记i
    int i = 0;
    //记录最小权值
    int min;
    //遍历全部节点，找出单节点
    for(i = 1;i <= n;i++){
        //如果此结点的父亲没有，那麽把结点好赋值给min，跳出循环
        if((*huffmanTree)[i].parent == 0){
            min = i;
            break;
        }
    }
    //继续遍历全部节点，找出权值最小节点
    for(i = 1; i <= n;i++){
        if((*huffmanTree)[i].parent == 0){
            if((*huffmanTree)[i].weight < (*huffmanTree)[min].weight){
                min = i;
            }
        }
    }
    //找到了最小权值的结点，s1指向
    *s1 = min;
    //遍历全部结点
    for(i = 1;i <= n;i++){
        //找出下一个节点，且没有被s1指向，那麽赋值i给min，跳出循环
        if((*huffmanTree)[i].parent == 0 && i!= (*s1)){
            min = i;
            break;
        }
    }
    //继续遍历全部结点，找到权值最小的那一个
    for(i = 1; i <= n;i++){
        if((*huffmanTree)[i].parent == 0 && i!= (*s1)){
            if((*huffmanTree)[i].weight < (*huffmanTree)[min].weight){
                min = i;
            }
        }
    }
    //s2指针指向第二个权值最小的叶子结点
    *s2 = min;
}